

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

optional_ptr<duckdb::RowVersionManager,_true> __thiscall
duckdb::RowGroup::GetVersionInfo(RowGroup *this)

{
  idx_t iVar1;
  MetadataManager *manager;
  reference pvVar2;
  MetadataManager *start;
  RowVersionManager *pRVar3;
  MetaBlockPointer delete_pointer;
  shared_ptr<duckdb::RowVersionManager,_true> loaded_info;
  shared_ptr<duckdb::RowVersionManager,_true> local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  if (((this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     (((this->deletes_is_loaded)._M_base._M_i & 1U) != 0)) {
    pRVar3 = (this->version_info)._M_i.ptr;
  }
  else {
    ::std::mutex::lock(&this->row_group_lock);
    if (((this->deletes_pointers).
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         (this->deletes_pointers).
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       (((this->deletes_is_loaded)._M_base._M_i & 1U) != 0)) {
      pRVar3 = (this->version_info)._M_i.ptr;
    }
    else {
      pvVar2 = vector<duckdb::MetaBlockPointer,_true>::get<true>(&this->deletes_pointers,0);
      iVar1 = pvVar2->block_pointer;
      manager = *(MetadataManager **)&pvVar2->offset;
      start = BlockManager::GetMetadataManager(((this->collection)._M_data)->block_manager);
      delete_pointer._8_8_ = iVar1;
      delete_pointer.block_pointer = (idx_t)&local_38;
      RowVersionManager::Deserialize(delete_pointer,manager,(idx_t)start);
      local_48.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_38;
      local_48.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = a_Stack_30[0]._M_pi;
      local_38 = (element_type *)0x0;
      a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      SetVersionInfo(this,&local_48);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.internal.
                  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      LOCK();
      (this->deletes_is_loaded)._M_base._M_i = true;
      UNLOCK();
      pRVar3 = (this->version_info)._M_i.ptr;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->row_group_lock);
  }
  return (optional_ptr<duckdb::RowVersionManager,_true>)pRVar3;
}

Assistant:

optional_ptr<RowVersionManager> RowGroup::GetVersionInfo() {
	if (!HasUnloadedDeletes()) {
		// deletes are loaded - return the version info
		return version_info;
	}
	lock_guard<mutex> lock(row_group_lock);
	// double-check after obtaining the lock whether or not deletes are still not loaded to avoid double load
	if (!HasUnloadedDeletes()) {
		return version_info;
	}
	// deletes are not loaded - reload
	auto root_delete = deletes_pointers[0];
	auto loaded_info = RowVersionManager::Deserialize(root_delete, GetBlockManager().GetMetadataManager(), start);
	SetVersionInfo(std::move(loaded_info));
	deletes_is_loaded = true;
	return version_info;
}